

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

double P_GetFriction(AActor *mo,double *frictionfactor)

{
  F3DFloor *pFVar1;
  double *this;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Self *other;
  F3DFloor **ppFVar7;
  FTerrainDef *pFVar8;
  secplane_t *psVar9;
  sector_t *psVar10;
  double dVar11;
  double dVar12;
  TVector2<double> local_e0;
  TVector2<double> local_d0;
  TVector2<double> local_c0;
  TVector2<double> local_b0;
  TVector2<double> local_a0;
  F3DFloor *local_90;
  F3DFloor *rover_1;
  undefined1 local_80 [4];
  uint i_1;
  DVector3 pos;
  F3DFloor *rover;
  uint i;
  TFlags<ActorFlag2,_unsigned_int> local_4c;
  sector_t *local_48;
  sector_t *sec;
  msecnode_t *m;
  double newmf;
  double newfriction;
  double movefactor;
  double friction;
  double *frictionfactor_local;
  AActor *mo_local;
  
  movefactor = 0.90625;
  newfriction = 0.03125;
  friction = (double)frictionfactor;
  frictionfactor_local = (double *)mo;
  bVar2 = AActor::IsNoClip2(mo);
  if (!bVar2) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_4c,(int)frictionfactor_local + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
    bVar2 = false;
    if (uVar4 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&i,
                 (int)frictionfactor_local +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&i);
      bVar2 = uVar4 != 0;
    }
    if (bVar2) {
      movefactor = 0.91796875;
    }
    else {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)((long)&rover + 4),
                 (int)frictionfactor_local +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&rover + 4));
      if (((uVar4 != 0) || (bVar2 = true, *(int *)(frictionfactor_local + 0x54) < 2)) &&
         (bVar2 = false, *(int *)(frictionfactor_local + 0x54) == 1)) {
        dVar11 = AActor::Z((AActor *)frictionfactor_local);
        bVar2 = frictionfactor_local[0x24] + 6.0 < dVar11;
      }
      if (bVar2) {
        movefactor = sector_t::GetFriction((sector_t *)frictionfactor_local[0x22],0,&newfriction);
        newfriction = newfriction * 0.5;
        for (rover._0_4_ = 0; uVar4 = (uint)rover,
            uVar5 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)((long)frictionfactor_local[0x22] + 0x200) + 0x70)),
            uVar4 < uVar5; rover._0_4_ = (uint)rover + 1) {
          ppFVar7 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)((long)frictionfactor_local[0x22] + 0x200) + 0x70),
                               (ulong)(uint)rover);
          pFVar1 = *ppFVar7;
          if (((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 0x10) != 0)) {
            dVar11 = AActor::Z((AActor *)frictionfactor_local);
            dVar12 = secplane_t::ZatPoint((pFVar1->top).plane,(AActor *)frictionfactor_local);
            if (dVar11 <= dVar12) {
              dVar11 = AActor::Z((AActor *)frictionfactor_local);
              dVar12 = secplane_t::ZatPoint((pFVar1->bottom).plane,(AActor *)frictionfactor_local);
              if ((dVar12 <= dVar11) &&
                 ((newmf = sector_t::GetFriction(pFVar1->model,(pFVar1->top).isceiling,(double *)&m)
                  , newmf < movefactor || ((movefactor == 0.90625 && (!NAN(movefactor))))))) {
                newfriction = (double)m * 0.5;
                movefactor = newmf;
              }
            }
          }
        }
      }
      else {
        bVar3 = FBoolCVar::operator_cast_to_bool(&var_friction);
        bVar2 = false;
        if (bVar3) {
          other = (Self *)((long)frictionfactor_local + 0x18c);
          operator|((int)&pos + MF_NOBLOCKMAP,MF_NOCLIP);
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)((long)&pos.Z + 4),other);
          uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pos.Z + 4));
          bVar2 = uVar4 == 0;
        }
        if (bVar2) {
          for (sec = (sector_t *)frictionfactor_local[0x6b]; sec != (sector_t *)0x0;
              sec = (sector_t *)sec->planes[0].xform.xScale) {
            local_48 = (sector_t *)sec->planes[0].xform.xOffs;
            AActor::PosRelative((DVector3 *)local_80,(AActor *)frictionfactor_local,local_48);
            for (rover_1._4_4_ = 0; uVar4 = rover_1._4_4_,
                uVar5 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                                  ((TArray<F3DFloor_*,_F3DFloor_*> *)&local_48->e->XFloor),
                uVar4 < uVar5; rover_1._4_4_ = rover_1._4_4_ + 1) {
              ppFVar7 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                                  ((TArray<F3DFloor_*,_F3DFloor_*> *)&local_48->e->XFloor,
                                   (ulong)rover_1._4_4_);
              this = frictionfactor_local;
              local_90 = *ppFVar7;
              if ((local_90->flags & 1) != 0) {
                if ((local_90->flags & 2) == 0) {
                  if ((local_90->flags & 0x10) != 0) {
                    dVar11 = AActor::Z((AActor *)frictionfactor_local);
                    psVar9 = (local_90->top).plane;
                    TVector2<double>::TVector2(&local_b0,(TVector3<double> *)local_80);
                    dVar12 = secplane_t::ZatPoint(psVar9,&local_b0);
                    bVar2 = true;
                    if (dVar11 <= dVar12) {
                      dVar11 = AActor::Top((AActor *)frictionfactor_local);
                      psVar9 = (local_90->bottom).plane;
                      TVector2<double>::TVector2(&local_c0,(TVector3<double> *)local_80);
                      dVar12 = secplane_t::ZatPoint(psVar9,&local_c0);
                      bVar2 = dVar11 < dVar12;
                    }
                    if (!bVar2) goto LAB_0066bc74;
                  }
                }
                else {
                  psVar9 = (local_90->top).plane;
                  TVector2<double>::TVector2(&local_a0,(TVector3<double> *)local_80);
                  dVar11 = secplane_t::ZatPoint(psVar9,&local_a0);
                  bVar2 = AActor::isAtZ((AActor *)this,dVar11);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_0066bc74:
                    newmf = sector_t::GetFriction
                                      (local_90->model,(local_90->top).isceiling,(double *)&m);
                    if ((newmf < movefactor) || ((movefactor == 0.90625 && (!NAN(movefactor))))) {
                      newfriction = (double)m;
                      movefactor = newmf;
                    }
                  }
                }
              }
            }
            if ((local_48->Flags & 0x10) == 0) {
              iVar6 = sector_t::GetTerrain(local_48,0);
              pFVar8 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)iVar6);
              if ((pFVar8->Friction != 0.0) || (NAN(pFVar8->Friction))) goto LAB_0066bd21;
            }
            else {
LAB_0066bd21:
              newmf = sector_t::GetFriction(local_48,0,(double *)&m);
              if (newmf < movefactor) {
LAB_0066bd6a:
                dVar11 = AActor::Z((AActor *)frictionfactor_local);
                psVar9 = &local_48->floorplane;
                TVector2<double>::TVector2(&local_d0,(TVector3<double> *)local_80);
                dVar12 = secplane_t::ZatPoint(psVar9,&local_d0);
                bVar2 = true;
                if (dVar12 < dVar11) {
                  psVar10 = sector_t::GetHeightSec(local_48);
                  bVar2 = false;
                  if (psVar10 != (sector_t *)0x0) {
                    dVar11 = AActor::Z((AActor *)frictionfactor_local);
                    psVar10 = local_48->heightsec;
                    TVector2<double>::TVector2(&local_e0,(TVector3<double> *)local_80);
                    dVar12 = secplane_t::ZatPoint(&psVar10->floorplane,&local_e0);
                    bVar2 = dVar11 <= dVar12;
                  }
                }
              }
              else {
                bVar2 = false;
                if ((movefactor == 0.90625) && (!NAN(movefactor))) goto LAB_0066bd6a;
              }
              if (bVar2) {
                movefactor = newmf;
                newfriction = (double)m;
              }
            }
          }
        }
      }
    }
  }
  if ((frictionfactor_local[0x5d] != 1.0) || (NAN(frictionfactor_local[0x5d]))) {
    movefactor = clamp<double>(movefactor * frictionfactor_local[0x5d],0.0,1.0);
    newfriction = FrictionToMoveFactor(movefactor);
  }
  if (friction != 0.0) {
    *(double *)friction = newfriction;
  }
  return movefactor;
}

Assistant:

double P_GetFriction(const AActor *mo, double *frictionfactor)
{
	double friction = ORIG_FRICTION;
	double movefactor = ORIG_FRICTION_FACTOR;
	double newfriction;
	double newmf;

	const msecnode_t *m;
	sector_t *sec;

	if (mo->IsNoClip2())
	{
		// The default values are fine for noclip2 mode
	}
	else if (mo->flags2 & MF2_FLY && mo->flags & MF_NOGRAVITY)
	{
		friction = FRICTION_FLY;
	}
	else if ((!(mo->flags & MF_NOGRAVITY) && mo->waterlevel > 1) ||
		(mo->waterlevel == 1 && mo->Z() > mo->floorz+ 6))
	{
		friction = mo->Sector->GetFriction(sector_t::floor, &movefactor);
		movefactor *= 0.5;

		// Check 3D floors -- might be the source of the waterlevel
		for (unsigned i = 0; i < mo->Sector->e->XFloor.ffloors.Size(); i++)
		{
			F3DFloor *rover = mo->Sector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;
			if (!(rover->flags & FF_SWIMMABLE)) continue;

			if (mo->Z() > rover->top.plane->ZatPoint(mo) ||
				mo->Z() < rover->bottom.plane->ZatPoint(mo))
				continue;

			newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
			if (newfriction < friction || friction == ORIG_FRICTION)
			{
				friction = newfriction;
				movefactor = newmf * 0.5;
			}
		}
	}
	else if (var_friction && !(mo->flags & (MF_NOCLIP | MF_NOGRAVITY)))
	{	// When the object is straddling sectors with the same
		// floor height that have different frictions, use the lowest
		// friction value (muddy has precedence over icy).

		for (m = mo->touching_sectorlist; m; m = m->m_tnext)
		{
			sec = m->m_sector;
			DVector3 pos = mo->PosRelative(sec);

			// 3D floors must be checked, too
			for (unsigned i = 0; i < sec->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;

				if (rover->flags & FF_SOLID)
				{
					// Must be standing on a solid floor
					if (!mo->isAtZ(rover->top.plane->ZatPoint(pos))) continue;
				}
				else if (rover->flags & FF_SWIMMABLE)
				{
					// Or on or inside a swimmable floor (e.g. in shallow water)
					if (mo->Z() > rover->top.plane->ZatPoint(pos) ||
						(mo->Top()) < rover->bottom.plane->ZatPoint(pos))
						continue;
				}
				else
					continue;

				newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
				if (newfriction < friction || friction == ORIG_FRICTION)
				{
					friction = newfriction;
					movefactor = newmf;
				}
			}

			if (!(sec->Flags & SECF_FRICTION) &&
				Terrains[sec->GetTerrain(sector_t::floor)].Friction == 0)
			{
				continue;
			}
			newfriction = sec->GetFriction(sector_t::floor, &newmf);
			if ((newfriction < friction || friction == ORIG_FRICTION) &&
				(mo->Z() <= sec->floorplane.ZatPoint(pos) ||
				(sec->GetHeightSec() != NULL &&
				mo->Z() <= sec->heightsec->floorplane.ZatPoint(pos))))
			{
				friction = newfriction;
				movefactor = newmf;
			}
		}
	}

	if (mo->Friction != 1)
	{
		friction = clamp((friction * mo->Friction), 0., 1.);
		movefactor = FrictionToMoveFactor(friction);
	}

	if (frictionfactor)
		*frictionfactor = movefactor;

	return friction;
}